

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetNameTest.cpp
# Opt level: O0

int __thiscall
GetNameTest::SubmitName(GetNameTest *this,uint8_t *packet,uint32_t length,uint32_t start)

{
  int iVar1;
  size_t local_430;
  size_t name_len;
  uint8_t name [1024];
  uint32_t start_local;
  uint32_t length_local;
  uint8_t *packet_local;
  GetNameTest *this_local;
  
  local_430 = 0;
  iVar1 = DnsStats::GetDnsName(packet,length,start,(uint8_t *)&name_len,0x400,&local_430);
  if (local_430 != 0) {
    DnsStats::SetToUpperCase((uint8_t *)&name_len,local_430);
    fprintf((FILE *)this->test_out,"%s\n",&name_len);
  }
  return iVar1;
}

Assistant:

int GetNameTest::SubmitName(uint8_t * packet, uint32_t length, uint32_t start)
{
    uint8_t name[1024];
    size_t name_len = 0;
    
    start = stats->GetDnsName(packet, length, start, name, sizeof(name), &name_len);

    if (name_len > 0) {
        DnsStats::SetToUpperCase(name, name_len);
        fprintf(test_out, "%s\n", (char *)name);
    }

    return start;
}